

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_job_pool.hpp
# Opt level: O1

mmap_disk_job * __thiscall
libtorrent::aux::disk_job_pool<libtorrent::aux::mmap_disk_job>::
allocate_job<libtorrent::aux::job::read,std::shared_ptr<libtorrent::aux::mmap_storage>,std::function<void(libtorrent::disk_buffer_holder,libtorrent::storage_error_const&)>,libtorrent::disk_buffer_holder,unsigned_short,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,int_const&>
          (disk_job_pool<libtorrent::aux::mmap_disk_job> *this,disk_job_flags_t flags,
          shared_ptr<libtorrent::aux::mmap_storage> *stor,
          function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)> *args,
          disk_buffer_holder *args_1,unsigned_short *args_2,
          strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *args_3,int *args_4)

{
  _Manager_type p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  mmap_disk_job *pmVar4;
  void *ret;
  _Any_data local_f8;
  _Manager_type local_e8;
  _Invoker_type local_e0;
  disk_buffer_holder local_d8;
  unsigned_short local_c0;
  int local_bc;
  int local_b8;
  disk_job *local_b0;
  uchar local_a8;
  undefined1 uStack_a7;
  undefined6 uStack_a6;
  undefined4 uStack_a0;
  uint uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 local_90;
  _Variant_storage<false,_libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
  local_88;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_job_mutex);
  if (iVar3 == 0) {
    pmVar4 = (mmap_disk_job *)
             (this->m_job_pool).super_pool<libtorrent::aux::allocator_new_delete>.
             super_simple_segregated_storage<unsigned_long>.first;
    if (pmVar4 == (mmap_disk_job *)0x0) {
      pmVar4 = (mmap_disk_job *)
               boost::pool<libtorrent::aux::allocator_new_delete>::ordered_malloc_need_resize
                         (&(this->m_job_pool).super_pool<libtorrent::aux::allocator_new_delete>);
    }
    else {
      (this->m_job_pool).super_pool<libtorrent::aux::allocator_new_delete>.
      super_simple_segregated_storage<unsigned_long>.first =
           (pmVar4->super_disk_job).super_tailqueue_node<libtorrent::aux::disk_job>.next;
    }
    local_b0 = (disk_job *)0x0;
    uStack_a7 = 0;
    uStack_a0 = 0;
    uStack_9c = uStack_9c & 0xffffff00;
    local_98 = 0x4ee500;
    uStack_94 = 0;
    local_90 = 0xffffff;
    local_e8 = (_Manager_type)0x0;
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_e0 = args->_M_invoker;
    p_Var1 = (args->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_f8._M_unused._0_8_ = (undefined8)*(undefined8 *)&(args->super__Function_base)._M_functor
      ;
      local_f8._8_8_ = *(undefined8 *)((long)&(args->super__Function_base)._M_functor + 8);
      (args->super__Function_base)._M_manager = (_Manager_type)0x0;
      args->_M_invoker = (_Invoker_type)0x0;
      local_e8 = p_Var1;
    }
    local_a8 = flags.m_val;
    disk_buffer_holder::disk_buffer_holder(&local_d8,args_1);
    local_c0 = *args_2;
    local_bc = args_3->m_val;
    local_b8 = *args_4;
    ::std::__detail::__variant::_Uninitialized<libtorrent::aux::job::read,_false>::
    _Uninitialized<libtorrent::aux::job::read>
              ((_Uninitialized<libtorrent::aux::job::read,_false> *)&local_88,&local_f8);
    local_88._M_index = '\0';
    (pmVar4->super_disk_job).super_tailqueue_node<libtorrent::aux::disk_job>.next = local_b0;
    (pmVar4->super_disk_job).flags = (disk_job_flags_t)local_a8;
    (pmVar4->super_disk_job).ret = (status_t)uStack_a7;
    *(undefined6 *)&(pmVar4->super_disk_job).field_0xa = uStack_a6;
    (pmVar4->super_disk_job).error.ec.val_ = uStack_a0;
    (pmVar4->super_disk_job).error.ec.failed_ = (bool)(char)uStack_9c;
    *(int3 *)&(pmVar4->super_disk_job).error.ec.field_0x5 = (int3)(uStack_9c >> 8);
    *(ulong *)&(pmVar4->super_disk_job).error.ec.failed_ = CONCAT44(local_98,uStack_9c);
    *(ulong *)((long)&(pmVar4->super_disk_job).error.ec.cat_ + 4) = CONCAT44(local_90,uStack_94);
    ::std::__detail::__variant::
    _Move_ctor_base<false,_libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
    ::_Move_ctor_base((_Move_ctor_base<false,_libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                       *)&(pmVar4->super_disk_job).action,
                      (_Move_ctor_base<false,_libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
                       *)&local_88);
    (pmVar4->storage).super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (stor->super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (pmVar4->storage).super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (stor->super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (stor->super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pmVar4->storage).super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    (stor->super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    ::std::__detail::__variant::
    _Variant_storage<false,_libtorrent::aux::job::read,_libtorrent::aux::job::write,_libtorrent::aux::job::hash,_libtorrent::aux::job::hash2,_libtorrent::aux::job::move_storage,_libtorrent::aux::job::release_files,_libtorrent::aux::job::delete_files,_libtorrent::aux::job::check_fastresume,_libtorrent::aux::job::rename_file,_libtorrent::aux::job::stop_torrent,_libtorrent::aux::job::file_priority,_libtorrent::aux::job::clear_piece,_libtorrent::aux::job::partial_read>
    ::~_Variant_storage(&local_88);
    disk_buffer_holder::~disk_buffer_holder(&local_d8);
    if (local_e8 != (_Manager_type)0x0) {
      (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    }
    (this->m_job_pool).super_pool<libtorrent::aux::allocator_new_delete>.start_size = 100;
    (this->m_job_pool).super_pool<libtorrent::aux::allocator_new_delete>.next_size = 100;
    this->m_jobs_in_use = this->m_jobs_in_use + 1;
    this->m_read_jobs = this->m_read_jobs + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_job_mutex);
    return pmVar4;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

T* allocate_job(
			disk_job_flags_t const flags
			, Storage stor
			, Args&&... args)
		{
			std::lock_guard<std::mutex> l(m_job_mutex);
			auto* ptr = m_job_pool.malloc();
			new (ptr) T{
				disk_job{
				tailqueue_node<disk_job>{},
				flags,
				status_t{},
				storage_error{},
				JobType{std::forward<Args>(args)...},
#if TORRENT_USE_ASSERTS
				true, // in_use
				false, // job_posted
				false, // callback_called
				false, // blocked
#endif
				},
				std::move(stor)};
			m_job_pool.set_next_size(100);
			++m_jobs_in_use;
			if constexpr (std::is_same_v<JobType, job::read>)
				++m_read_jobs;
			else if constexpr (std::is_same_v<JobType, job::write>)
				++m_write_jobs;

			return ptr;
		}